

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosStream.cpp
# Opt level: O2

StepStatus __thiscall
adiosStream::readADIOS
          (adiosStream *this,CommandRead *cmdR,Config *cfg,Settings *settings,size_t step)

{
  Engine *pEVar1;
  pointer psVar2;
  __shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  double dVar4;
  double dVar5;
  uint uVar6;
  ostream *poVar7;
  unsigned_long __val;
  shared_ptr<VariableInfo> *v;
  pointer psVar8;
  __shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2> *p_Var9;
  long lVar10;
  bool bVar11;
  int totalRanks;
  int myRank;
  StepStatus local_184;
  Engine *local_180;
  vector<double,_std::allocator<double>_> readtime_all_ranks;
  double readTime;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  varmap;
  _Rb_tree_node_base local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  __shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2> local_100;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((settings->myRank == 0) && (settings->verbose != 0)) {
    poVar7 = std::operator<<((ostream *)&std::cout,"    Read ");
    poVar7 = std::operator<<(poVar7,(string *)&cmdR->streamName);
    poVar7 = std::operator<<(poVar7," with timeout value ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,cmdR->timeout_sec);
    poVar7 = std::operator<<(poVar7," using the group ");
    std::operator<<(poVar7,(string *)&cmdR->groupName);
    if ((cmdR->variables).
        super__Vector_base<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (cmdR->variables).
        super__Vector_base<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::operator<<((ostream *)&std::cout," with selected variables:  ");
      psVar2 = (cmdR->variables).
               super__Vector_base<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar8 = (cmdR->variables).
                    super__Vector_base<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; psVar8 != psVar2; psVar8 = psVar8 + 1
          ) {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 (string *)
                                 (psVar8->
                                 super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr);
        std::operator<<(poVar7," ");
      }
    }
    poVar7 = std::operator<<((ostream *)&std::cout,"... ");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  MPI_Barrier(this->comm);
  dVar4 = (double)MPI_Wtime();
  pEVar1 = &this->engine;
  local_184 = adios2::Engine::BeginStep((StepMode)pEVar1,cmdR->timeout_sec);
  if (local_184 == OK) {
    local_180 = pEVar1;
    if (settings->myRank == 0) {
      uVar6 = settings->verbose;
      if (step == 1 && uVar6 != 0) {
        adios2::IO::AvailableVariables_abi_cxx11_(SUB81(&varmap,0));
        poVar7 = std::operator<<((ostream *)&std::cout,"    Variables in input for reading: ");
        std::endl<char,std::char_traits<char>>(poVar7);
        for (; local_148._M_left != &local_148;
            local_148._M_left = (_Base_ptr)std::_Rb_tree_increment(local_148._M_left)) {
          poVar7 = std::operator<<((ostream *)&std::cout,"        ");
          poVar7 = std::operator<<(poVar7,(string *)(local_148._M_left + 1));
          std::endl<char,std::char_traits<char>>(poVar7);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                     *)&varmap);
        uVar6 = settings->verbose;
        bVar11 = settings->myRank != 0;
      }
      else {
        bVar11 = false;
      }
      if ((!bVar11) && (uVar6 != 0)) {
        poVar7 = std::operator<<((ostream *)&std::cout,"    Read data ");
        std::endl<char,std::char_traits<char>>(poVar7);
      }
    }
    p_Var3 = &((cmdR->variables).
               super__Vector_base<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>;
    for (p_Var9 = &((cmdR->variables).
                    super__Vector_base<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>; p_Var9 != p_Var3;
        p_Var9 = p_Var9 + 1) {
      std::__shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2> *)&varmap,p_Var9);
      std::__shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_100,(__shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2> *)&varmap);
      getADIOSArray(this,(shared_ptr<VariableInfo> *)&local_100);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_148);
    }
    if ((step == 1) && (settings->fixedPattern == true)) {
      if ((settings->myRank == 0) && (settings->verbose != 0)) {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "        Lock Reader Selections for Fixed Pattern before first EndStep"
                                );
        std::endl<char,std::char_traits<char>>(poVar7);
      }
      adios2::Engine::LockWriterDefinitions();
    }
    adios2::Engine::EndStep();
    dVar5 = (double)MPI_Wtime();
    MPI_Comm_rank(this->comm,&myRank);
    MPI_Comm_size(this->comm,&totalRanks);
    if (this->hasIOTimer == true) {
      readTime = dVar5 - dVar4;
      readtime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      readtime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      readtime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (myRank == 0) {
        std::vector<double,_std::allocator<double>_>::reserve(&readtime_all_ranks,(long)totalRanks);
      }
      MPI_Gather(&readTime,1,&ompi_mpi_double,
                 readtime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,1,&ompi_mpi_double,0,this->comm);
      if (myRank == 0) {
        for (lVar10 = 0; lVar10 < totalRanks; lVar10 = lVar10 + 1) {
          __val = adios2::Engine::CurrentStep();
          std::__cxx11::to_string(&local_d0,__val);
          std::operator+(&local_120,&local_d0,",");
          std::__cxx11::to_string(&local_f0,(int)lVar10);
          std::operator+(&local_90,&local_120,&local_f0);
          std::operator+(&local_70,&local_90,",read,");
          std::__cxx11::to_string
                    (&local_b0,
                     readtime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar10]);
          std::operator+(&local_50,&local_70,&local_b0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &varmap,&local_50,"\n");
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_d0);
          fputs(_varmap,(FILE *)this->perfLogFP);
          std::__cxx11::string::~string((string *)&varmap);
        }
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&readtime_all_ranks.super__Vector_base<double,_std::allocator<double>_>);
    }
  }
  return local_184;
}

Assistant:

adios2::StepStatus adiosStream::readADIOS(CommandRead *cmdR, Config &cfg, const Settings &settings,
                                          size_t step)
{
    if (!settings.myRank && settings.verbose)
    {
        std::cout << "    Read " << cmdR->streamName << " with timeout value " << cmdR->timeout_sec
                  << " using the group " << cmdR->groupName;
        if (!cmdR->variables.empty())
        {
            std::cout << " with selected variables:  ";
            for (const auto &v : cmdR->variables)
            {
                std::cout << v->name << " ";
            }
        }
        std::cout << "... " << std::endl;
    }
    double timeStart, timeEnd;
    double readTime;
    // double maxReadTime, minReadTime;
    MPI_Barrier(comm);
    timeStart = MPI_Wtime();
    adios2::StepStatus status = engine.BeginStep(cmdR->stepMode, cmdR->timeout_sec);
    if (status != adios2::StepStatus::OK)
    {
        return status;
    }

    if (!settings.myRank && settings.verbose && step == 1)
    {
        const auto varmap = io.AvailableVariables();
        std::cout << "    Variables in input for reading: " << std::endl;
        for (const auto &v : varmap)
        {
            std::cout << "        " << v.first << std::endl;
        }
    }

    if (!settings.myRank && settings.verbose)
    {
        std::cout << "    Read data " << std::endl;
    }

    for (auto ov : cmdR->variables)
    {
        getADIOSArray(ov);
    }

    if (step == 1 && settings.fixedPattern)
    {
        if (!settings.myRank && settings.verbose)
        {
            std::cout << "        Lock Reader Selections for Fixed Pattern before "
                         "first EndStep"
                      << std::endl;
        }
        engine.LockWriterDefinitions();
    }

    engine.EndStep();
    timeEnd = MPI_Wtime();
    int myRank, totalRanks;
    MPI_Comm_rank(comm, &myRank);
    MPI_Comm_size(comm, &totalRanks);
    if (hasIOTimer)
    {
        readTime = timeEnd - timeStart;
        // double *writetime_all_ranks = NULL;
        std::vector<double> readtime_all_ranks;
        if (myRank == 0)
        {
            // writetime_all_ranks = (double *)malloc(totalRanks);
            //	if (!writetime_all_ranks)
            //	{
            //	    std::cout << "rank " << myRank << ": malloc failed!" <<
            // std::endl;
            //	}
            //	else
            //	{
            //	    std::cout << "rank " << myRank << ": malloc succeeded!" <<
            // std::endl;
            //	}
            readtime_all_ranks.reserve(totalRanks);
        }

        MPI_Gather(&readTime, 1, MPI_DOUBLE, readtime_all_ranks.data(), 1, MPI_DOUBLE, 0, comm);
        if (myRank == 0)
        {
            for (int i = 0; i < totalRanks; i++)
            {
                std::string content = std::to_string(engine.CurrentStep()) + "," +
                                      std::to_string(i) + ",read," +
                                      std::to_string(readtime_all_ranks[i]) + "\n";
                // std::cout << content;
                fputs(content.c_str(), perfLogFP);
            }
        }
    }

    // for (auto ov : cmdR->variables)
    // {
    //     if (settings.myRank == 1)
    //     {
    //         size_t varsize = std::accumulate(ov->count.begin(),
    //         ov->count.end(), 1,
    //                             std::multiplies<std::size_t>());
    //         std::cout << ov->name << ", " << varsize << std::endl;
    //         const double *dd = reinterpret_cast<double *>(ov->data.data());
    //         for (int j = 0; j < varsize; j++)
    //             std::cout << dd[j] << ", ";
    //         std::cout << std::endl;
    //     }
    // }
    return status;
}